

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJacobiEigenSolver.cpp
# Opt level: O2

void testMinMaxEigenValue<Imath_3_2::Matrix44<double>>(Matrix44<double> *A)

{
  long lVar1;
  Vec4 *pVVar2;
  BaseType_conflict3 BVar3;
  long lVar4;
  TV maxV;
  TV minV;
  Matrix44<double> V;
  TV S;
  Matrix44<double> A1;
  Matrix44<double> U;
  Vec4 local_260 [32];
  Vec4 local_240 [32];
  double local_220 [16];
  Matrix44 local_1a0 [128];
  Matrix44 local_120 [128];
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  local_a0 = 0x3ff0000000000000;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0x3ff0000000000000;
  local_70 = 0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0x3ff0000000000000;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0x3ff0000000000000;
  local_220[0] = 1.0;
  local_220[1] = 0.0;
  local_220[2] = 0.0;
  local_220[3] = 0.0;
  local_220[4] = 0.0;
  local_220[5] = 1.0;
  local_220[6] = 0.0;
  local_220[7] = 0.0;
  local_220[8] = 0.0;
  local_220[9] = 0.0;
  local_220[10] = 1.0;
  local_220[0xb] = 0.0;
  local_220[0xc] = 0.0;
  local_220[0xd] = 0.0;
  local_220[0xe] = 0.0;
  local_220[0xf] = 1.0;
  BVar3 = computeThreshold<Imath_3_2::Matrix44<double>>(A);
  Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)local_120,A);
  Imath_3_2::minEigenVector<Imath_3_2::Matrix44<double>,Imath_3_2::Vec4<double>>
            (local_120,local_240);
  Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)local_1a0,A);
  Imath_3_2::maxEigenVector<Imath_3_2::Matrix44<double>,Imath_3_2::Vec4<double>>
            (local_1a0,local_260);
  Imath_3_2::Matrix44<double>::Matrix44((Matrix44<double> *)local_120,A);
  lVar4 = 0;
  Imath_3_2::jacobiSVD<double>
            (local_120,(Matrix44 *)&local_a0,(Vec4 *)local_1a0,(Matrix44 *)local_220,
             2.220446049250313e-16,false);
  while( true ) {
    if (lVar4 == 0x20) {
      return;
    }
    if (BVar3 <= ABS(*(double *)(local_240 + lVar4) -
                     *(double *)((long)local_220 + lVar4 * 4 + 0x18))) break;
    pVVar2 = local_260 + lVar4;
    lVar1 = lVar4 * 4;
    lVar4 = lVar4 + 8;
    if (BVar3 <= ABS(*(double *)pVVar2 - *(double *)((long)local_220 + lVar1))) {
      __assert_fail("abs (maxV[i] - V[i][0]) < threshold",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                    ,0x98,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<double>]"
                   );
    }
  }
  __assert_fail("abs (minV[i] - V[i][dim - 1]) < threshold",
                "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testJacobiEigenSolver.cpp"
                ,0x97,"void testMinMaxEigenValue(const TM &) [TM = Imath_3_2::Matrix44<double>]");
}

Assistant:

void
testMinMaxEigenValue (const TM& A)
{
    typedef typename TM::BaseVecType TV;
    typedef typename TM::BaseType    T;

    TV minV, maxV, S;
    TM U, V;

    const T threshold = computeThreshold (A);

    {
        TM A1 (A);
        minEigenVector (A1, minV);
        TM A2 (A);
        maxEigenVector (A2, maxV);
    }
    {
        TM A3 (A);
        jacobiSVD (A3, U, S, V);
    }

    const int dim = TM::dimensions ();

    for (int i = 0; i < dim; ++i)
    {
        assert (abs (minV[i] - V[i][dim - 1]) < threshold);
        assert (abs (maxV[i] - V[i][0]) < threshold);
    }
}